

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_scan.hpp
# Opt level: O1

void duckdb::PatasScanPartial<double>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  data_ptr_t pdVar1;
  PatasScanState<double> *this;
  ulong group_size;
  ulong uVar2;
  
  this = (PatasScanState<double> *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator*(&state->scan_state);
  pdVar1 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  if (scan_count != 0) {
    uVar2 = 0;
    do {
      group_size = 0x400 - (ulong)((uint)this->total_value_count & 0x3ff);
      if (scan_count - uVar2 < group_size) {
        group_size = scan_count - uVar2;
      }
      PatasScanState<double>::ScanGroup<unsigned_long,false>
                (this,(unsigned_long *)(pdVar1 + uVar2 * 8 + result_offset * 8),group_size);
      uVar2 = uVar2 + group_size;
    } while (uVar2 < scan_count);
  }
  return;
}

Assistant:

void PatasScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                      idx_t result_offset) {
	using EXACT_TYPE = typename FloatingToExact<T>::TYPE;
	auto &scan_state = (PatasScanState<T> &)*state.scan_state;

	// Get the pointer to the result values
	auto current_result_ptr = FlatVector::GetData<EXACT_TYPE>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);
	current_result_ptr += result_offset;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		const auto remaining = scan_count - scanned;
		const idx_t to_scan = MinValue(remaining, scan_state.LeftInGroup());

		scan_state.template ScanGroup<EXACT_TYPE>(current_result_ptr + scanned, to_scan);
		scanned += to_scan;
	}
}